

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void __thiscall CaDiCaL::Options::reset_default_values(Options *this)

{
  if (this->arena != 1) {
    this->arena = 1;
  }
  if (this->arenacompact != 1) {
    this->arenacompact = 1;
  }
  if (this->arenasort != 1) {
    this->arenasort = 1;
  }
  if (this->arenatype != 3) {
    this->arenatype = 3;
  }
  if (this->binary != 1) {
    this->binary = 1;
  }
  if (this->block != 0) {
    this->block = 0;
  }
  if (this->blockmaxclslim != 100000) {
    this->blockmaxclslim = 100000;
  }
  if (this->blockminclslim != 2) {
    this->blockminclslim = 2;
  }
  if (this->blockocclim != 100) {
    this->blockocclim = 100;
  }
  if (this->bump != 1) {
    this->bump = 1;
  }
  if (this->bumpreason != 1) {
    this->bumpreason = 1;
  }
  if (this->bumpreasondepth != 1) {
    this->bumpreasondepth = 1;
  }
  if (this->chrono != 1) {
    this->chrono = 1;
  }
  if (this->chronoalways != 0) {
    this->chronoalways = 0;
  }
  if (this->chronolevelim != 100) {
    this->chronolevelim = 100;
  }
  if (this->chronoreusetrail != 1) {
    this->chronoreusetrail = 1;
  }
  if (this->compact != 1) {
    this->compact = 1;
  }
  if (this->compactint != 2000) {
    this->compactint = 2000;
  }
  if (this->compactlim != 100) {
    this->compactlim = 100;
  }
  if (this->compactmin != 100) {
    this->compactmin = 100;
  }
  if (this->condition != 0) {
    this->condition = 0;
  }
  if (this->conditionint != 10000) {
    this->conditionint = 10000;
  }
  if (this->conditionmaxeff != 10000000) {
    this->conditionmaxeff = 10000000;
  }
  if (this->conditionmaxrat != 100) {
    this->conditionmaxrat = 100;
  }
  if (this->conditionmineff != 1000000) {
    this->conditionmineff = 1000000;
  }
  if (this->conditionreleff != 100) {
    this->conditionreleff = 100;
  }
  if (this->cover != 0) {
    this->cover = 0;
  }
  if (this->covermaxclslim != 100000) {
    this->covermaxclslim = 100000;
  }
  if (this->covermaxeff != 100000000) {
    this->covermaxeff = 100000000;
  }
  if (this->coverminclslim != 2) {
    this->coverminclslim = 2;
  }
  if (this->covermineff != 1000000) {
    this->covermineff = 1000000;
  }
  if (this->coverreleff != 4) {
    this->coverreleff = 4;
  }
  if (this->decompose != 1) {
    this->decompose = 1;
  }
  if (this->decomposerounds != 2) {
    this->decomposerounds = 2;
  }
  if (this->deduplicate != 1) {
    this->deduplicate = 1;
  }
  if (this->eagersubsume != 1) {
    this->eagersubsume = 1;
  }
  if (this->eagersubsumelim != 0x14) {
    this->eagersubsumelim = 0x14;
  }
  if (this->elim != 1) {
    this->elim = 1;
  }
  if (this->elimands != 1) {
    this->elimands = 1;
  }
  if (this->elimaxeff != 2000000000) {
    this->elimaxeff = 2000000000;
  }
  if (this->elimbackward != 1) {
    this->elimbackward = 1;
  }
  if (this->elimboundmax != 0x10) {
    this->elimboundmax = 0x10;
  }
  if (this->elimboundmin != 0) {
    this->elimboundmin = 0;
  }
  if (this->elimclslim != 100) {
    this->elimclslim = 100;
  }
  if (this->elimequivs != 1) {
    this->elimequivs = 1;
  }
  if (this->elimineff != 10000000) {
    this->elimineff = 10000000;
  }
  if (this->elimint != 2000) {
    this->elimint = 2000;
  }
  if (this->elimites != 1) {
    this->elimites = 1;
  }
  if (this->elimlimited != 1) {
    this->elimlimited = 1;
  }
  if (this->elimocclim != 100) {
    this->elimocclim = 100;
  }
  if (this->elimprod != 1) {
    this->elimprod = 1;
  }
  if (this->elimreleff != 1000) {
    this->elimreleff = 1000;
  }
  if (this->elimrounds != 2) {
    this->elimrounds = 2;
  }
  if (this->elimsubst != 1) {
    this->elimsubst = 1;
  }
  if (this->elimsum != 1) {
    this->elimsum = 1;
  }
  if (this->elimxorlim != 5) {
    this->elimxorlim = 5;
  }
  if (this->elimxors != 1) {
    this->elimxors = 1;
  }
  if (this->emagluefast != 0x21) {
    this->emagluefast = 0x21;
  }
  if (this->emaglueslow != 100000) {
    this->emaglueslow = 100000;
  }
  if (this->emajump != 100000) {
    this->emajump = 100000;
  }
  if (this->emalevel != 100000) {
    this->emalevel = 100000;
  }
  if (this->emasize != 100000) {
    this->emasize = 100000;
  }
  if (this->ematrailfast != 100) {
    this->ematrailfast = 100;
  }
  if (this->ematrailslow != 100000) {
    this->ematrailslow = 100000;
  }
  if (this->exteagerreasons != 1) {
    this->exteagerreasons = 1;
  }
  if (this->exteagerrecalc != 1) {
    this->exteagerrecalc = 1;
  }
  if (this->externallrat != 0) {
    this->externallrat = 0;
  }
  if (this->flush != 0) {
    this->flush = 0;
  }
  if (this->flushfactor != 3) {
    this->flushfactor = 3;
  }
  if (this->flushint != 100000) {
    this->flushint = 100000;
  }
  if (this->forcephase != 0) {
    this->forcephase = 0;
  }
  if (this->frat != 0) {
    this->frat = 0;
  }
  if (this->idrup != 0) {
    this->idrup = 0;
  }
  if (this->ilb != 0) {
    this->ilb = 0;
  }
  if (this->ilbassumptions != 0) {
    this->ilbassumptions = 0;
  }
  if (this->inprocessing != 1) {
    this->inprocessing = 1;
  }
  if (this->instantiate != 0) {
    this->instantiate = 0;
  }
  if (this->instantiateclslim != 3) {
    this->instantiateclslim = 3;
  }
  if (this->instantiateocclim != 1) {
    this->instantiateocclim = 1;
  }
  if (this->instantiateonce != 1) {
    this->instantiateonce = 1;
  }
  if (this->lidrup != 0) {
    this->lidrup = 0;
  }
  if (this->lrat != 0) {
    this->lrat = 0;
  }
  if (this->lucky != 1) {
    this->lucky = 1;
  }
  if (this->minimize != 1) {
    this->minimize = 1;
  }
  if (this->minimizedepth != 1000) {
    this->minimizedepth = 1000;
  }
  if (this->otfs != 1) {
    this->otfs = 1;
  }
  if (this->phase != 1) {
    this->phase = 1;
  }
  if (this->probe != 1) {
    this->probe = 1;
  }
  if (this->probehbr != 1) {
    this->probehbr = 1;
  }
  if (this->probeint != 5000) {
    this->probeint = 5000;
  }
  if (this->probemaxeff != 100000000) {
    this->probemaxeff = 100000000;
  }
  if (this->probemineff != 1000000) {
    this->probemineff = 1000000;
  }
  if (this->probereleff != 0x14) {
    this->probereleff = 0x14;
  }
  if (this->proberounds != 1) {
    this->proberounds = 1;
  }
  if (this->radixsortlim != 0x20) {
    this->radixsortlim = 0x20;
  }
  if (this->reduce != 1) {
    this->reduce = 1;
  }
  if (this->reduceint != 300) {
    this->reduceint = 300;
  }
  if (this->reducetarget != 0x4b) {
    this->reducetarget = 0x4b;
  }
  if (this->reducetier1glue != 2) {
    this->reducetier1glue = 2;
  }
  if (this->reducetier2glue != 6) {
    this->reducetier2glue = 6;
  }
  if (this->reluctant != 0x400) {
    this->reluctant = 0x400;
  }
  if (this->reluctantmax != 0x100000) {
    this->reluctantmax = 0x100000;
  }
  if (this->rephase != 1) {
    this->rephase = 1;
  }
  if (this->rephaseint != 1000) {
    this->rephaseint = 1000;
  }
  if (this->report != reportdefault) {
    this->report = reportdefault;
  }
  if (this->reportall != 0) {
    this->reportall = 0;
  }
  if (this->reportsolve != 0) {
    this->reportsolve = 0;
  }
  if (this->restart != 1) {
    this->restart = 1;
  }
  if (this->restartint != 2) {
    this->restartint = 2;
  }
  if (this->restartmargin != 10) {
    this->restartmargin = 10;
  }
  if (this->restartreusetrail != 1) {
    this->restartreusetrail = 1;
  }
  if (this->restoreall != 0) {
    this->restoreall = 0;
  }
  if (this->restoreflush != 0) {
    this->restoreflush = 0;
  }
  if (this->reverse != 0) {
    this->reverse = 0;
  }
  if (this->score != 1) {
    this->score = 1;
  }
  if (this->scorefactor != 0x3b6) {
    this->scorefactor = 0x3b6;
  }
  if (this->seed != 0) {
    this->seed = 0;
  }
  if (this->shrink != 3) {
    this->shrink = 3;
  }
  if (this->shrinkreap != 1) {
    this->shrinkreap = 1;
  }
  if (this->shuffle != 0) {
    this->shuffle = 0;
  }
  if (this->shufflequeue != 1) {
    this->shufflequeue = 1;
  }
  if (this->shufflerandom != 0) {
    this->shufflerandom = 0;
  }
  if (this->shufflescores != 1) {
    this->shufflescores = 1;
  }
  if (this->stabilize != 1) {
    this->stabilize = 1;
  }
  if (this->stabilizefactor != 200) {
    this->stabilizefactor = 200;
  }
  if (this->stabilizeint != 1000) {
    this->stabilizeint = 1000;
  }
  if (this->stabilizemaxint != 2000000000) {
    this->stabilizemaxint = 2000000000;
  }
  if (this->stabilizeonly != 0) {
    this->stabilizeonly = 0;
  }
  if (this->stats != 0) {
    this->stats = 0;
  }
  if (this->subsume != 1) {
    this->subsume = 1;
  }
  if (this->subsumebinlim != 10000) {
    this->subsumebinlim = 10000;
  }
  if (this->subsumeclslim != 100) {
    this->subsumeclslim = 100;
  }
  if (this->subsumeint != 10000) {
    this->subsumeint = 10000;
  }
  if (this->subsumelimited != 1) {
    this->subsumelimited = 1;
  }
  if (this->subsumemaxeff != 100000000) {
    this->subsumemaxeff = 100000000;
  }
  if (this->subsumemineff != 1000000) {
    this->subsumemineff = 1000000;
  }
  if (this->subsumeocclim != 100) {
    this->subsumeocclim = 100;
  }
  if (this->subsumereleff != 1000) {
    this->subsumereleff = 1000;
  }
  if (this->subsumestr != 1) {
    this->subsumestr = 1;
  }
  if (this->target != 1) {
    this->target = 1;
  }
  if (this->terminateint != 10) {
    this->terminateint = 10;
  }
  if (this->ternary != 1) {
    this->ternary = 1;
  }
  if (this->ternarymaxadd != 1000) {
    this->ternarymaxadd = 1000;
  }
  if (this->ternarymaxeff != 100000000) {
    this->ternarymaxeff = 100000000;
  }
  if (this->ternarymineff != 1000000) {
    this->ternarymineff = 1000000;
  }
  if (this->ternaryocclim != 100) {
    this->ternaryocclim = 100;
  }
  if (this->ternaryreleff != 10) {
    this->ternaryreleff = 10;
  }
  if (this->ternaryrounds != 2) {
    this->ternaryrounds = 2;
  }
  if (this->transred != 1) {
    this->transred = 1;
  }
  if (this->transredmaxeff != 100000000) {
    this->transredmaxeff = 100000000;
  }
  if (this->transredmineff != 1000000) {
    this->transredmineff = 1000000;
  }
  if (this->transredreleff != 100) {
    this->transredreleff = 100;
  }
  if (this->veripb != 0) {
    this->veripb = 0;
  }
  if (this->vivify != 1) {
    this->vivify = 1;
  }
  if (this->vivifyinst != 1) {
    this->vivifyinst = 1;
  }
  if (this->vivifymaxeff != 20000000) {
    this->vivifymaxeff = 20000000;
  }
  if (this->vivifymineff != 20000) {
    this->vivifymineff = 20000;
  }
  if (this->vivifyonce != 0) {
    this->vivifyonce = 0;
  }
  if (this->vivifyredeff != 0x4b) {
    this->vivifyredeff = 0x4b;
  }
  if (this->vivifyreleff != 0x14) {
    this->vivifyreleff = 0x14;
  }
  if (this->walk != 1) {
    this->walk = 1;
  }
  if (this->walkmaxeff != 10000000) {
    this->walkmaxeff = 10000000;
  }
  if (this->walkmineff != 100000) {
    this->walkmineff = 100000;
  }
  if (this->walknonstable != 1) {
    this->walknonstable = 1;
  }
  if (this->walkredundant != 0) {
    this->walkredundant = 0;
  }
  if (this->walkreleff != 0x14) {
    this->walkreleff = 0x14;
  }
  return;
}

Assistant:

void Options::reset_default_values () {
  size_t count = 0;
#define OPTION(N, V, L, H, O, P, R, D) \
  do { \
    if (!(R)) \
      break; \
    if (N == (V)) \
      break; \
    LOG ("resetting option '%s' to default %s", #N, #V); \
    count++; \
    N = (int) (V); \
  } while (0);
  OPTIONS
#undef OPTION
  LOG ("reset %zd options to their default values", count);
#ifndef LOGGING
  (void) count;
#endif
}